

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.hpp
# Opt level: O1

void __thiscall mxx::env::~env(env *this)

{
  undefined8 in_RAX;
  int init;
  int fin;
  undefined8 local_8;
  
  this->_vptr_env = (_func_int **)&PTR__env_0014b380;
  local_8 = in_RAX;
  MPI_Initialized(&local_8);
  if ((int)local_8 != 0) {
    MPI_Finalized((long)&local_8 + 4);
    if (local_8._4_4_ == 0) {
      MPI_Finalize();
    }
  }
  return;
}

Assistant:

virtual ~env() {
        if (env::initialized() && !env::finalized()) {
            MPI_Finalize();
        }
    }